

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void __thiscall BaseIndex::Sync(BaseIndex *this)

{
  ConstevalFormatString<1U> fmt;
  ConstevalFormatString<2U> fmt_00;
  ConstevalFormatString<2U> fmt_01;
  ConstevalFormatString<1U> fmt_02;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  bool bVar1;
  strong_ordering sVar2;
  __pointer_type args_1;
  seconds sVar3;
  CBlockIndex *block_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  BlockManager *in_RDI;
  long in_FS_OFFSET;
  CBlockIndex *pindex_next;
  time_point current_time;
  time_point last_locator_write_time;
  time_point last_log_time;
  CBlockIndex *pindex;
  BlockInfo block_info;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock12;
  CBlock block;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  char *in_stack_fffffffffffffd00;
  CBlockIndex *in_stack_fffffffffffffd08;
  BaseIndex *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  char *in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd28;
  strong_ordering in_stack_fffffffffffffd2f;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_fffffffffffffd30;
  CBlockIndex *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  strong_ordering in_stack_fffffffffffffd47;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_fffffffffffffd48;
  undefined6 in_stack_fffffffffffffd50;
  byte in_stack_fffffffffffffd56;
  undefined1 in_stack_fffffffffffffd57;
  ConstevalFormatString<2U> in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd68;
  BaseIndex *in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffda8;
  int iVar5;
  undefined4 in_stack_fffffffffffffdac;
  size_t in_stack_fffffffffffffdb0;
  __pointer_type in_stack_fffffffffffffdb8;
  size_t in_stack_fffffffffffffdc0;
  char *pcVar6;
  BlockManager *pBVar7;
  Level in_stack_fffffffffffffea0;
  Level level;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  undefined1 local_140 [32];
  undefined1 *local_120;
  undefined1 local_78 [112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pBVar7 = in_RDI;
  args_1 = std::atomic<const_CBlockIndex_*>::load
                     ((atomic<const_CBlockIndex_*> *)in_stack_fffffffffffffd10,
                      (memory_order)((ulong)in_stack_fffffffffffffd08 >> 0x20));
  bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffd10);
  iVar5 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  if (bVar1) {
LAB_00f70e78:
    if (args_1 == (__pointer_type)0x0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (char *)in_stack_fffffffffffffd10);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (char *)in_stack_fffffffffffffd10);
      iVar5 = 0;
      GetName_abi_cxx11_((BaseIndex *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8))
      ;
      logging_function_02._M_str = (char *)pBVar7;
      logging_function_02._M_len = in_stack_fffffffffffffdc0;
      source_file_02._M_str = (char *)in_stack_fffffffffffffdb8;
      source_file_02._M_len = in_stack_fffffffffffffdb0;
      fmt_02.fmt._4_4_ = in_stack_fffffffffffffdac;
      fmt_02.fmt._0_4_ = in_stack_fffffffffffffda8;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_02,source_file_02,iVar5,(LogFlags)in_RDI,in_stack_fffffffffffffea0
                 ,fmt_02,in_stack_fffffffffffffeb0);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (char *)in_stack_fffffffffffffd10);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (char *)in_stack_fffffffffffffd10);
      GetName_abi_cxx11_((BaseIndex *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8))
      ;
      logging_function_01._M_str = (char *)pBVar7;
      logging_function_01._M_len = in_stack_fffffffffffffdc0;
      source_file_01._M_str = (char *)in_stack_fffffffffffffdb8;
      source_file_01._M_len = in_stack_fffffffffffffdb0;
      fmt_01.fmt._4_4_ = in_stack_fffffffffffffdac;
      fmt_01.fmt._0_4_ = in_stack_fffffffffffffda8;
      LogPrintFormatInternal<std::__cxx11::string,int>
                (logging_function_01,source_file_01,iVar5,(LogFlags)in_RDI,in_stack_fffffffffffffea0
                 ,fmt_01,in_stack_fffffffffffffeb0,(int *)args_1);
    }
  }
  else {
    sVar3 = s<(char)48>();
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffd00,
               (duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                 (duration *)0xf70784);
    s<(char)48>();
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffd00,
               (duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                 (duration *)0xf707bb);
    while( true ) {
      bVar1 = CThreadInterrupt::operator_cast_to_bool
                        ((CThreadInterrupt *)
                         CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      level = (Level)sVar3.__r;
      iVar5 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
      if (bVar1) break;
      MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                ((AnnotatedMixin<std::recursive_mutex> *)
                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      in_stack_fffffffffffffdb8 =
           Sync::anon_class_16_2_f8b6d4d5::operator()
                     ((anon_class_16_2_f8b6d4d5 *)
                      CONCAT17(in_stack_fffffffffffffd2f._M_value,in_stack_fffffffffffffd28));
      if (in_stack_fffffffffffffdb8 == (CBlockIndex *)0x0) {
        SetBestBlockIndex(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
        Commit(in_stack_fffffffffffffd70);
        MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                  ((AnnotatedMixin<std::recursive_mutex> *)
                   CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffd38,
                   (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd30.__d.__r,
                   (char *)CONCAT17(in_stack_fffffffffffffd2f._M_value,in_stack_fffffffffffffd28),
                   in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c,
                   SUB41((uint)in_stack_fffffffffffffd18 >> 0x18,0));
        in_stack_fffffffffffffd58.fmt =
             (char *)NextSyncBlock((CBlockIndex *)in_stack_fffffffffffffd10,
                                   (CChain *)in_stack_fffffffffffffd08);
        in_stack_fffffffffffffdb8 = (__pointer_type)in_stack_fffffffffffffd58.fmt;
        if ((CBlockIndex *)in_stack_fffffffffffffd58.fmt == (CBlockIndex *)0x0) {
          std::atomic<bool>::operator=
                    ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                     false);
          in_stack_fffffffffffffda8 = 3;
        }
        else {
          in_stack_fffffffffffffda8 = 0;
        }
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                   CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        in_stack_fffffffffffffea0 = (Level)sVar3.__r;
        iVar5 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
        if (in_stack_fffffffffffffda8 != 0) goto LAB_00f70e78;
        in_stack_fffffffffffffda8 = 0;
      }
      if ((in_stack_fffffffffffffdb8->pprev != args_1) &&
         (bVar1 = Rewind((BaseIndex *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                         (CBlockIndex *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08), !bVar1
         )) {
        GetName_abi_cxx11_((BaseIndex *)
                           CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        FatalErrorf<char[5],std::__cxx11::string>
                  ((BaseIndex *)in_stack_fffffffffffffd48.__d.__r,in_stack_fffffffffffffd58,
                   (char (*) [5])
                   CONCAT17(in_stack_fffffffffffffd47._M_value,in_stack_fffffffffffffd40),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd38);
        goto LAB_00f70fac;
      }
      args_1 = in_stack_fffffffffffffdb8;
      CBlock::CBlock((CBlock *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      kernel::MakeBlockInfo
                ((CBlockIndex *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (CBlock *)in_stack_fffffffffffffd10);
      in_stack_fffffffffffffd57 =
           ::node::BlockManager::ReadBlockFromDisk
                     (in_RDI,(CBlock *)in_stack_fffffffffffffd58.fmt,
                      (CBlockIndex *)
                      CONCAT17(in_stack_fffffffffffffd57,
                               CONCAT16(in_stack_fffffffffffffd56,in_stack_fffffffffffffd50)));
      if ((bool)in_stack_fffffffffffffd57) {
        local_120 = local_78;
        in_stack_fffffffffffffd56 =
             (**(code **)((in_RDI->cs_LastBlockFile).super_recursive_mutex.
                          super___recursive_mutex_base._M_mutex.__align + 0x60))(in_RDI,local_140);
        if ((in_stack_fffffffffffffd56 & 1) == 0) {
          CBlockIndex::GetBlockHash(in_stack_fffffffffffffd08);
          base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffd00);
          FatalErrorf<char[5],std::__cxx11::string>
                    ((BaseIndex *)in_stack_fffffffffffffd48.__d.__r,in_stack_fffffffffffffd58,
                     (char (*) [5])
                     CONCAT17(in_stack_fffffffffffffd47._M_value,in_stack_fffffffffffffd40),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd38);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          iVar5 = 1;
        }
        else {
          pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::chrono::_V2::steady_clock::now();
          in_stack_fffffffffffffd48 =
               std::chrono::operator+
                         ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)in_stack_fffffffffffffd00,
                          (duration<long,_std::ratio<1L,_1L>_> *)
                          CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          sVar2 = std::chrono::
                  operator<=><std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_fffffffffffffd00,
                             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          in_stack_fffffffffffffd47 = sVar2;
          std::__cmp_cat::__unspec::__unspec
                    ((__unspec *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                     (__unspec *)0xf70cc1);
          bVar1 = std::operator<(sVar2._M_value);
          if (bVar1) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                       (char *)in_stack_fffffffffffffd10);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                       (char *)in_stack_fffffffffffffd10);
            in_stack_fffffffffffffd08 =
                 (CBlockIndex *)
                 GetName_abi_cxx11_((BaseIndex *)
                                    CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
            in_stack_fffffffffffffd10 = (BaseIndex *)&args_1->nHeight;
            in_stack_fffffffffffffd00 = "Syncing %s with block chain from height %d\n";
            in_stack_fffffffffffffcf8 = 2;
            logging_function_00._M_str = (char *)pBVar7;
            logging_function_00._M_len = in_stack_fffffffffffffdc0;
            source_file_00._M_str = (char *)in_stack_fffffffffffffdb8;
            source_file_00._M_len = in_stack_fffffffffffffdb0;
            fmt_00.fmt._4_4_ = in_stack_fffffffffffffdac;
            fmt_00.fmt._0_4_ = in_stack_fffffffffffffda8;
            in_stack_fffffffffffffd38 = in_stack_fffffffffffffd08;
            LogPrintFormatInternal<std::__cxx11::string,int>
                      (logging_function_00,source_file_00,
                       (int)((ulong)in_stack_fffffffffffffd68 >> 0x20),(LogFlags)in_RDI,
                       (Level)sVar3.__r,fmt_00,in_stack_fffffffffffffeb0,(int *)args_1);
            in_stack_fffffffffffffeb0 = pbVar4;
          }
          in_stack_fffffffffffffd30 =
               std::chrono::operator+
                         ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)in_stack_fffffffffffffd00,
                          (duration<long,_std::ratio<1L,_1L>_> *)
                          CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          sVar2 = std::chrono::
                  operator<=><std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_fffffffffffffd00,
                             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          in_stack_fffffffffffffd2f = sVar2;
          std::__cmp_cat::__unspec::__unspec
                    ((__unspec *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                     (__unspec *)0xf70df0);
          bVar1 = std::operator<(sVar2._M_value);
          if (bVar1) {
            SetBestBlockIndex(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
            Commit(in_stack_fffffffffffffd70);
          }
          iVar5 = 0;
        }
      }
      else {
        CBlockIndex::GetBlockHash(in_stack_fffffffffffffd08);
        base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffd00);
        FatalErrorf<char[5],std::__cxx11::string>
                  ((BaseIndex *)in_stack_fffffffffffffd48.__d.__r,in_stack_fffffffffffffd58,
                   (char (*) [5])
                   CONCAT17(in_stack_fffffffffffffd47._M_value,in_stack_fffffffffffffd40),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd38);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        iVar5 = 1;
      }
      CBlock::~CBlock((CBlock *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      if (iVar5 != 0) goto LAB_00f70fac;
      in_stack_fffffffffffffda8 = 0;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
               (char *)in_stack_fffffffffffffd10);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
               (char *)in_stack_fffffffffffffd10);
    pcVar6 = "%s: m_interrupt set; exiting ThreadSync\n";
    block_00 = (CBlockIndex *)
               GetName_abi_cxx11_((BaseIndex *)
                                  CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    logging_function._M_str = (char *)pBVar7;
    logging_function._M_len = (size_t)pcVar6;
    source_file._M_str = (char *)in_stack_fffffffffffffdb8;
    source_file._M_len = in_stack_fffffffffffffdb0;
    fmt.fmt._4_4_ = in_stack_fffffffffffffdac;
    fmt.fmt._0_4_ = in_stack_fffffffffffffda8;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,iVar5,(LogFlags)in_RDI,level,fmt,
               in_stack_fffffffffffffeb0);
    SetBestBlockIndex(in_stack_fffffffffffffd10,block_00);
    Commit(in_stack_fffffffffffffd70);
  }
LAB_00f70fac:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BaseIndex::Sync()
{
    const CBlockIndex* pindex = m_best_block_index.load();
    if (!m_synced) {
        std::chrono::steady_clock::time_point last_log_time{0s};
        std::chrono::steady_clock::time_point last_locator_write_time{0s};
        while (true) {
            if (m_interrupt) {
                LogPrintf("%s: m_interrupt set; exiting ThreadSync\n", GetName());

                SetBestBlockIndex(pindex);
                // No need to handle errors in Commit. If it fails, the error will be already be
                // logged. The best way to recover is to continue, as index cannot be corrupted by
                // a missed commit to disk for an advanced index state.
                Commit();
                return;
            }

            const CBlockIndex* pindex_next = WITH_LOCK(cs_main, return NextSyncBlock(pindex, m_chainstate->m_chain));
            // If pindex_next is null, it means pindex is the chain tip, so
            // commit data indexed so far.
            if (!pindex_next) {
                SetBestBlockIndex(pindex);
                // No need to handle errors in Commit. See rationale above.
                Commit();

                // If pindex is still the chain tip after committing, exit the
                // sync loop. It is important for cs_main to be locked while
                // setting m_synced = true, otherwise a new block could be
                // attached while m_synced is still false, and it would not be
                // indexed.
                LOCK(::cs_main);
                pindex_next = NextSyncBlock(pindex, m_chainstate->m_chain);
                if (!pindex_next) {
                    m_synced = true;
                    break;
                }
            }
            if (pindex_next->pprev != pindex && !Rewind(pindex, pindex_next->pprev)) {
                FatalErrorf("%s: Failed to rewind index %s to a previous chain tip", __func__, GetName());
                return;
            }
            pindex = pindex_next;


            CBlock block;
            interfaces::BlockInfo block_info = kernel::MakeBlockInfo(pindex);
            if (!m_chainstate->m_blockman.ReadBlockFromDisk(block, *pindex)) {
                FatalErrorf("%s: Failed to read block %s from disk",
                           __func__, pindex->GetBlockHash().ToString());
                return;
            } else {
                block_info.data = &block;
            }
            if (!CustomAppend(block_info)) {
                FatalErrorf("%s: Failed to write block %s to index database",
                           __func__, pindex->GetBlockHash().ToString());
                return;
            }

            auto current_time{std::chrono::steady_clock::now()};
            if (last_log_time + SYNC_LOG_INTERVAL < current_time) {
                LogPrintf("Syncing %s with block chain from height %d\n",
                          GetName(), pindex->nHeight);
                last_log_time = current_time;
            }

            if (last_locator_write_time + SYNC_LOCATOR_WRITE_INTERVAL < current_time) {
                SetBestBlockIndex(pindex);
                last_locator_write_time = current_time;
                // No need to handle errors in Commit. See rationale above.
                Commit();
            }
        }
    }

    if (pindex) {
        LogPrintf("%s is enabled at height %d\n", GetName(), pindex->nHeight);
    } else {
        LogPrintf("%s is enabled\n", GetName());
    }
}